

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate-license.cpp
# Opt level: O3

string * license::test::generate_license
                   (string *__return_storage_ptr__,string *license_name,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *other_args)

{
  shared_count *this;
  pointer pcVar1;
  size_type sVar2;
  pointer pbVar3;
  long lVar4;
  long lVar5;
  undefined1 uVar6;
  ostream *poVar7;
  long lVar8;
  ulong uVar9;
  int sectionSize;
  undefined8 local_460;
  SI_Error *local_458;
  undefined **local_450;
  ulong local_448;
  shared_count sStack_440;
  SI_Error **local_438;
  SI_Error rc;
  int retCode;
  path license_fname;
  path licenses_base;
  string license_name_norm;
  char *local_3c0;
  char *local_3b8;
  shared_count sStack_3b0;
  string license_fname_s;
  undefined **local_388;
  undefined1 local_380;
  undefined1 *local_378;
  char *local_370;
  undefined1 local_368 [24];
  char *local_350;
  _Rb_tree_node_base local_348;
  size_t local_328;
  _List_node_base local_320;
  undefined7 local_310;
  undefined4 uStack_309;
  bool local_305;
  int local_304;
  undefined4 local_2fc;
  path lcc_exe;
  int *local_2d8;
  char *local_2d0;
  undefined **local_2c8;
  ulong local_2c0;
  shared_count sStack_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  stringstream ss;
  undefined1 *local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a0;
  ios_base local_138 [264];
  
  lcc_exe.m_pathname._M_dataplus._M_p = (pointer)&lcc_exe.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&lcc_exe,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O3/extern/license-generator/src/license_generator/lccgen"
             ,"");
  local_1c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x1e);
  boost::filesystem::detail::status((detail *)&ss,&lcc_exe,(error_code *)0x0);
  local_368[0] = _ss == 2;
  local_368._8_8_ = 0;
  local_368._16_8_ = 0;
  _ss = &PTR__lazy_ostream_0056bdb0;
  local_1a8 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x43e85a;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
  ;
  local_1e0 = "";
  boost::test_tools::tt_detail::report_assertion();
  this = (shared_count *)(local_368 + 0x10);
  boost::detail::shared_count::~shared_count(this);
  licenses_base.m_pathname._M_dataplus._M_p = (pointer)&licenses_base.m_pathname.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&licenses_base,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O3/Testing/Temporary/DEFAULT/licenses"
             ,"");
  boost::filesystem::detail::status((detail *)&ss,&licenses_base,(error_code *)0x0);
  if (_ss < 2) {
    local_1f8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_1f0 = "";
    local_208 = &boost::unit_test::basic_cstring<char_const>::null;
    local_200 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x21);
    uVar6 = boost::filesystem::detail::create_directories(&licenses_base,(error_code *)0x0);
    local_450 = (undefined **)CONCAT71(local_450._1_7_,uVar6);
    local_448 = 0;
    sStack_440.pi_ = (sp_counted_base *)0x0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                   "test folders created ",&licenses_base.m_pathname);
    _ss = &PTR__lazy_ostream_0056bdf0;
    local_1a8 = boost::unit_test::lazy_ostream::inst;
    local_218 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
    ;
    local_210 = "";
    local_1a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368;
    boost::test_tools::tt_detail::report_assertion(&local_450,&ss,&local_218,0x21,2,1,0);
    if ((shared_count *)local_368._0_8_ != this) {
      operator_delete((void *)local_368._0_8_);
    }
    boost::detail::shared_count::~shared_count(&sStack_440);
  }
  pcVar1 = (license_name->_M_dataplus)._M_p;
  sVar2 = license_name->_M_string_length;
  lVar8 = 0;
  while ((-lVar8 != sVar2 && (lVar8 != -4))) {
    lVar5 = lVar8 + (sVar2 - 1);
    lVar4 = lVar8 + 3;
    lVar8 = lVar8 + -1;
    if (pcVar1[lVar5] != ".lic"[lVar4]) {
LAB_0019fadd:
      license_name_norm._M_dataplus._M_p = (pointer)&license_name_norm.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&license_name_norm,pcVar1,pcVar1 + sVar2);
      std::__cxx11::string::append((char *)&license_name_norm);
LAB_0019fb0b:
      _ss = &local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&ss,license_name_norm._M_dataplus._M_p,
                 license_name_norm._M_dataplus._M_p + license_name_norm._M_string_length);
      license_fname.m_pathname._M_dataplus._M_p = (pointer)&license_fname.m_pathname.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&license_fname,licenses_base.m_pathname._M_dataplus._M_p,
                 licenses_base.m_pathname._M_dataplus._M_p +
                 licenses_base.m_pathname._M_string_length);
      boost::filesystem::path::operator/=(&license_fname,(path *)&ss);
      if (_ss != &local_1a8) {
        operator_delete(_ss);
      }
      license_fname_s._M_dataplus._M_p = (pointer)&license_fname_s.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&license_fname_s,license_fname.m_pathname._M_dataplus._M_p,
                 license_fname.m_pathname._M_dataplus._M_p +
                 license_fname.m_pathname._M_string_length);
      remove(license_fname_s._M_dataplus._M_p);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O3/extern/license-generator/src/license_generator/lccgen"
                 ,0x97);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," license issue",0xe)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," --primary-key ",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/projects/DEFAULT/private_key.rsa"
                 ,0x79);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," --output-file-name ",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,license_fname_s._M_dataplus._M_p,
                 license_fname_s._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8," --project-folder ",0x12);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/build_O3/Testing/Temporary/DEFAULT"
                 ,0x7b);
      if ((other_args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish !=
          (other_args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start) {
        lVar8 = 8;
        uVar9 = 0;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
          pbVar3 = (other_args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,*(char **)((long)pbVar3 + lVar8 + -8),
                     *(long *)((long)&(pbVar3->_M_dataplus)._M_p + lVar8));
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 < (ulong)((long)(other_args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(other_args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)std::cout,"executing :",0xb);
      std::__cxx11::stringbuf::str();
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)std::cout,(char *)local_368._0_8_,local_368._8_8_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if ((shared_count *)local_368._0_8_ != this) {
        operator_delete((void *)local_368._0_8_);
      }
      std::__cxx11::stringbuf::str();
      retCode = system((char *)local_368._0_8_);
      if ((shared_count *)local_368._0_8_ != this) {
        operator_delete((void *)local_368._0_8_);
      }
      local_228 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
      ;
      local_220 = "";
      local_238 = &boost::unit_test::basic_cstring<char_const>::null;
      local_230 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x33);
      local_380 = 0;
      local_388 = &PTR__lazy_ostream_0056b6a0;
      local_378 = boost::unit_test::lazy_ostream::inst;
      local_370 = "";
      local_458 = (SI_Error *)&local_460;
      local_2d8 = &retCode;
      local_2c8 = (undefined **)CONCAT71(local_2c8._1_7_,retCode == 0);
      local_460 = (SI_Error *)((ulong)local_460._4_4_ << 0x20);
      local_2c0 = 0;
      sStack_2b8.pi_ = (sp_counted_base *)0x0;
      local_3c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
      ;
      local_3b8 = "";
      local_350 = (char *)&local_2d8;
      local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
      local_368._0_8_ = &PTR__lazy_ostream_0056be30;
      local_368._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_438 = &local_458;
      local_448 = local_448 & 0xffffffffffffff00;
      local_450 = &PTR__lazy_ostream_0056be30;
      sStack_440.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      boost::test_tools::tt_detail::report_assertion
                (&local_2c8,&local_388,&local_3c0,0x33,2,2,2,"retCode",local_368,"0",&local_450);
      boost::detail::shared_count::~shared_count(&sStack_2b8);
      local_248 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
      ;
      local_240 = "";
      local_258 = &boost::unit_test::basic_cstring<char_const>::null;
      local_250 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248,0x34);
      boost::filesystem::detail::status((detail *)local_368,&license_fname,(error_code *)0x0);
      local_450 = (undefined **)CONCAT71(local_450._1_7_,1 < (uint)local_368._0_4_);
      local_448 = 0;
      sStack_440.pi_ = (sp_counted_base *)0x0;
      local_368._8_8_ = local_368._8_8_ & 0xffffffffffffff00;
      local_368._0_8_ = &PTR__lazy_ostream_0056be70;
      local_368._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_350 = "license exists";
      local_268 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
      ;
      local_260 = "";
      boost::test_tools::tt_detail::report_assertion(&local_450,local_368,&local_268,0x34,2,1,0);
      boost::detail::shared_count::~shared_count(&sStack_440);
      local_348._M_left = &local_348;
      local_348._M_color = _S_red;
      local_348._M_parent = (_Base_ptr)0x0;
      local_368._0_8_ = (pointer)0x0;
      local_368._8_8_ = 0;
      local_368._16_8_ = 0;
      local_328 = 0;
      local_320._M_next = &local_320;
      local_310 = 0;
      uStack_309 = 0;
      local_305 = true;
      local_304 = 0;
      local_348._M_right = local_348._M_left;
      local_320._M_prev = local_320._M_next;
      rc = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadFile
                     ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_368
                      ,license_fname.m_pathname._M_dataplus._M_p);
      local_278 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
      ;
      local_270 = "";
      local_288 = &boost::unit_test::basic_cstring<char_const>::null;
      local_280 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_278,0x37);
      local_2c0 = local_2c0 & 0xffffffffffffff00;
      local_2c8 = &PTR__lazy_ostream_0056b6a0;
      sStack_2b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_2b0 = "";
      sectionSize = 0;
      local_458 = &rc;
      local_3b8 = (char *)0x0;
      sStack_3b0.pi_ = (sp_counted_base *)0x0;
      local_2d8 = (int *)0x43e7dc;
      local_2d0 = "";
      local_448 = local_448 & 0xffffffffffffff00;
      local_450 = &PTR__lazy_ostream_0056beb0;
      sStack_440.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_438 = &local_458;
      local_380 = 0;
      local_388 = &PTR__lazy_ostream_0056be30;
      local_378 = boost::unit_test::lazy_ostream::inst;
      local_370 = (char *)&local_460;
      local_460 = &sectionSize;
      local_3c0._0_1_ = SI_FAIL < rc;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_3b0);
      sectionSize = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                    GetSectionSize((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>
                                    *)local_368,"DEFAULT");
      local_298 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Qt-Widgets[P]open-license-manager/test/functional/generate-license.cpp"
      ;
      local_290 = "";
      local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_298,0x39);
      local_2c0 = local_2c0 & 0xffffffffffffff00;
      local_2c8 = &PTR__lazy_ostream_0056b6a0;
      sStack_2b8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_2b0 = "";
      local_460 = &local_2fc;
      local_3c0 = (char *)CONCAT71(local_3c0._1_7_,0 < sectionSize);
      local_2fc = 0;
      local_3b8 = (char *)0x0;
      sStack_3b0.pi_ = (sp_counted_base *)0x0;
      local_2d8 = (int *)0x43e7dc;
      local_2d0 = "";
      local_448 = local_448 & 0xffffffffffffff00;
      local_450 = &PTR__lazy_ostream_0056be30;
      sStack_440.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      local_438 = &local_458;
      local_380 = 0;
      local_388 = &PTR__lazy_ostream_0056be30;
      local_378 = boost::unit_test::lazy_ostream::inst;
      local_370 = (char *)&local_460;
      local_458 = &sectionSize;
      boost::test_tools::tt_detail::report_assertion();
      boost::detail::shared_count::~shared_count(&sStack_3b0);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,license_fname.m_pathname._M_dataplus._M_p,
                 license_fname.m_pathname._M_dataplus._M_p +
                 license_fname.m_pathname._M_string_length);
      CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
                ((CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *)local_368);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)license_fname_s._M_dataplus._M_p != &license_fname_s.field_2) {
        operator_delete(license_fname_s._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)license_fname.m_pathname._M_dataplus._M_p != &license_fname.m_pathname.field_2) {
        operator_delete(license_fname.m_pathname._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)license_name_norm._M_dataplus._M_p != &license_name_norm.field_2) {
        operator_delete(license_name_norm._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)licenses_base.m_pathname._M_dataplus._M_p != &licenses_base.m_pathname.field_2) {
        operator_delete(licenses_base.m_pathname._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lcc_exe.m_pathname._M_dataplus._M_p != &lcc_exe.m_pathname.field_2) {
        operator_delete(lcc_exe.m_pathname._M_dataplus._M_p);
      }
      return __return_storage_ptr__;
    }
  }
  if (lVar8 == -4) {
    license_name_norm._M_dataplus._M_p = (pointer)&license_name_norm.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&license_name_norm,pcVar1,pcVar1 + sVar2);
    goto LAB_0019fb0b;
  }
  goto LAB_0019fadd;
}

Assistant:

string generate_license(const string& license_name, const vector<string>& other_args) {
	fs::path lcc_exe(LCC_EXE);
	BOOST_REQUIRE_MESSAGE(fs::is_regular_file(lcc_exe), "License generator not found: " LCC_EXE);
	fs::path licenses_base(LCC_LICENSES_BASE);
	if (!fs::exists(licenses_base)) {
		BOOST_REQUIRE_MESSAGE(fs::create_directories(licenses_base), "test folders created " + licenses_base.string());
	}
	const string license_name_norm = boost::ends_with(license_name, ".lic") ? license_name : (license_name + ".lic");
	const fs::path license_fname(licenses_base / license_name_norm);
	const string license_fname_s = license_fname.string();
	remove(license_fname_s.c_str());

	stringstream ss;
	ss << LCC_EXE << " license issue";
	ss << " --" PARAM_PRIMARY_KEY " " << LCC_PROJECT_PRIVATE_KEY;
	ss << " --" PARAM_LICENSE_OUTPUT " " << license_fname_s;
	ss << " --" PARAM_PROJECT_FOLDER " " << LCC_TEST_LICENSES_PROJECT;

	for (size_t i = 0; i < other_args.size(); i++) {
		ss << " " << other_args[i];
	}
	cout << "executing :" << ss.str() << endl;
	const int retCode = std::system(ss.str().c_str());
	BOOST_REQUIRE_EQUAL(retCode, 0);
	BOOST_REQUIRE_MESSAGE(fs::exists(license_fname), "license exists");
	CSimpleIniA ini;
	const SI_Error rc = ini.LoadFile(license_fname.c_str());
	BOOST_REQUIRE_GE(rc, 0);
	const int sectionSize = ini.GetSectionSize(LCC_PROJECT_NAME);
	BOOST_CHECK_GT(sectionSize, 0);
	return license_fname.string();
}